

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O3

void GD::save_load_online_state<sparse_parameters>
               (vw *all,io_buf *model_file,bool read,bool text,gd *g,stringstream *msg,
               sparse_parameters *weights)

{
  stringstream *psVar1;
  float fVar2;
  byte bVar3;
  long lVar4;
  size_t sVar5;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var6;
  _Hash_node_base *p_Var7;
  ostream *poVar8;
  vw_exception *this;
  long lVar9;
  undefined7 in_register_00000011;
  size_t sVar10;
  uint uVar11;
  ulong *data;
  _Hash_node_base *p_Var12;
  uint32_t old_i;
  uint64_t index;
  weight buff [4];
  stringstream __msg;
  undefined1 local_224 [4];
  ulong local_220;
  io_buf *local_218;
  stringstream *local_210;
  ulong local_208;
  uint local_1fc;
  gd *local_1f8;
  vw *local_1f0;
  char local_1e8 [16];
  string local_1d8;
  ulong local_1b8;
  float *local_1b0;
  ostream local_1a8;
  
  local_210 = (stringstream *)(1L << ((byte)all->num_bits & 0x3f));
  local_220 = 0;
  local_224 = (undefined1  [4])0x0;
  local_218 = model_file;
  local_1f8 = g;
  local_1f0 = all;
  if ((int)CONCAT71(in_register_00000011,read) == 0) {
    p_Var12 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      psVar1 = msg + 0x10;
      uVar11 = (uint)text;
      local_1fc = (uint)text;
      local_210 = msg;
      do {
        fVar2 = *(float *)&(p_Var12[2]._M_nxt)->_M_nxt;
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          local_220 = (ulong)p_Var12[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
          std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
          if (local_1f0->num_bits < 0x1f) {
            local_224 = (undefined1  [4])(uint)local_220;
            sVar5 = 4;
            data = (ulong *)local_224;
          }
          else {
            sVar5 = 8;
            data = &local_220;
          }
          bin_text_write_fixed(local_218,(char *)data,sVar5,msg,SUB41(uVar11,0));
          if (g == (gd *)0x0) {
LAB_001424d4:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,":",1);
            p_Var7 = p_Var12[2]._M_nxt;
            sVar5 = 4;
          }
          else {
            if (g->adaptive == false) {
              if (g->normalized == false) goto LAB_001424d4;
            }
            else if (g->normalized != false) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,":",1);
              poVar8 = std::ostream::_M_insert<double>
                                 ((double)*(float *)&(p_Var12[2]._M_nxt)->_M_nxt);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              poVar8 = std::ostream::_M_insert<double>
                                 ((double)*(float *)((long)&(p_Var12[2]._M_nxt)->_M_nxt + 4));
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
              p_Var7 = p_Var12[2]._M_nxt + 1;
              sVar5 = 0xc;
              goto LAB_001424f4;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,":",1);
            poVar8 = std::ostream::_M_insert<double>((double)*(float *)&(p_Var12[2]._M_nxt)->_M_nxt)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            p_Var7 = (_Hash_node_base *)((long)&(p_Var12[2]._M_nxt)->_M_nxt + 4);
            sVar5 = 8;
          }
LAB_001424f4:
          poVar8 = std::ostream::_M_insert<double>((double)*(float *)&p_Var7->_M_nxt);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          uVar11 = local_1fc;
          msg = local_210;
          bin_text_write_fixed
                    (local_218,(char *)p_Var12[2]._M_nxt,sVar5,local_210,SUB41(local_1fc,0));
        }
        p_Var12 = p_Var12->_M_nxt;
      } while (p_Var12 != (_Hash_node_base *)0x0);
    }
  }
  else {
    do {
      if (local_1f0->num_bits < 0x1f) {
        sVar5 = io_buf::bin_read_fixed(local_218,local_224,4,"");
        local_220 = (ulong)(uint)local_224;
      }
      else {
        sVar5 = io_buf::bin_read_fixed(local_218,(char *)&local_220,8,"");
      }
      if (sVar5 == 0) {
        return;
      }
      if (local_210 <= local_220) {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,"Model content is corrupted, weight vector index ",0x30);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," must be less than total vector length ",0x27);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/gd.cc"
                   ,0x314,&local_1d8);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1e8[0] = '\0';
      local_1e8[1] = '\0';
      local_1e8[2] = '\0';
      local_1e8[3] = '\0';
      local_1e8[4] = '\0';
      local_1e8[5] = '\0';
      local_1e8[6] = '\0';
      local_1e8[7] = '\0';
      local_1e8[8] = '\0';
      local_1e8[9] = '\0';
      local_1e8[10] = '\0';
      local_1e8[0xb] = '\0';
      local_1e8[0xc] = '\0';
      local_1e8[0xd] = '\0';
      local_1e8[0xe] = '\0';
      local_1e8[0xf] = '\0';
      sVar10 = 4;
      if (g != (gd *)0x0) {
        if (g->adaptive == false) {
          if (g->normalized != false) goto LAB_00142283;
        }
        else {
          sVar10 = 0xc;
          if (g->normalized == false) {
LAB_00142283:
            sVar10 = 8;
          }
        }
      }
      sVar10 = io_buf::bin_read_fixed(local_218,local_1e8,sVar10,"");
      bVar3 = (byte)weights->_stride_shift;
      local_208 = local_220 << (bVar3 & 0x3f) & weights->_weight_mask;
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)weights,&local_208);
      if (_Var6._M_cur == (__node_type *)0x0) {
        local_1b0 = calloc_or_throw<float>(1L << ((byte)weights->_stride_shift & 0x3f));
        local_1b8 = local_208;
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<unsigned_long,float*>>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)weights,&local_1b8);
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)weights,&local_208);
        g = local_1f8;
        if (weights->fun != (_func_void_weight_ptr_void_ptr *)0x0) {
          (*weights->fun)(*(weight **)((long)_Var6._M_cur + 0x10),weights->default_data);
          g = local_1f8;
        }
      }
      lVar4 = *(long *)((long)&((_Var6._M_cur)->
                               super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                               ).
                               super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                               ._M_storage._M_storage + 8);
      lVar9 = 0;
      do {
        *(undefined4 *)(lVar4 + lVar9 * 4) = *(undefined4 *)(local_1e8 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (1L << (bVar3 & 0x3f) != lVar9);
    } while (sVar5 + sVar10 != 0);
  }
  return;
}

Assistant:

void save_load_online_state(vw& all, io_buf& model_file, bool read, bool text, gd* g, stringstream& msg, T& weights)
{
  uint64_t length = (uint64_t)1 << all.num_bits;

  uint64_t i = 0;
  uint32_t old_i = 0;
  size_t brw = 1;

  if (read)
    do
    {
      brw = 1;
      if (all.num_bits < 31)  // backwards compatible
      {
        brw = model_file.bin_read_fixed((char*)&old_i, sizeof(old_i), "");
        i = old_i;
      }
      else
        brw = model_file.bin_read_fixed((char*)&i, sizeof(i), "");
      if (brw > 0)
      {
        if (i >= length)
          THROW("Model content is corrupted, weight vector index " << i << " must be less than total vector length "
                                                                   << length);
        weight buff[4] = {0, 0, 0, 0};
        if (g == NULL || (!g->adaptive && !g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]), "");
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 2, "");
        else  // adaptive and normalized
          brw += model_file.bin_read_fixed((char*)buff, sizeof(buff[0]) * 3, "");
        uint32_t stride = 1 << weights.stride_shift();
        weight* v = &weights.strided_index(i);
        for (size_t i = 0; i < stride; i++) v[i] = buff[i];
      }
    } while (brw > 0);
  else  // write binary or text
    for (typename T::iterator v = weights.begin(); v != weights.end(); ++v)
      if (*v != 0.)
      {
        i = v.index() >> weights.stride_shift();
        msg << i;
        if (all.num_bits < 31)
        {
          old_i = (uint32_t)i;
          brw = bin_text_write_fixed(model_file, (char*)&old_i, sizeof(old_i), msg, text);
        }
        else
          brw = bin_text_write_fixed(model_file, (char*)&i, sizeof(i), msg, text);

        if (g == nullptr || (!g->adaptive && !g->normalized))
        {
          msg << ":" << *v << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), sizeof(*v), msg, text);
        }
        else if ((g->adaptive && !g->normalized) || (!g->adaptive && g->normalized))
        {
          // either adaptive or normalized
          msg << ":" << *v << " " << (&(*v))[1] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 2 * sizeof(*v), msg, text);
        }
        else
        {
          // adaptive and normalized
          msg << ":" << *v << " " << (&(*v))[1] << " " << (&(*v))[2] << "\n";
          brw += bin_text_write_fixed(model_file, (char*)&(*v), 3 * sizeof(*v), msg, text);
        }
      }
}